

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_enum.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::objectivec::EnumGenerator::EnumGenerator
          (EnumGenerator *this,EnumDescriptor *descriptor)

{
  pointer *pppEVar1;
  iterator iVar2;
  EnumValueDescriptor *pEVar3;
  EnumDescriptor *in_RDX;
  long lVar4;
  EnumDescriptor *this_00;
  long lVar5;
  EnumValueDescriptor *value;
  EnumValueDescriptor *local_38;
  
  this->descriptor_ = descriptor;
  (this->base_values_).
  super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->base_values_).
  super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->base_values_).
  super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->all_values_).
  super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->all_values_).
  super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->all_values_).
  super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  EnumName_abi_cxx11_(&this->name_,(objectivec *)descriptor,in_RDX);
  this_00 = this->descriptor_;
  if (0 < *(int *)(this_00 + 0x2c)) {
    lVar5 = 0;
    lVar4 = 0;
    do {
      local_38 = (EnumValueDescriptor *)(*(long *)(this_00 + 0x30) + lVar5);
      pEVar3 = EnumDescriptor::FindValueByNumber
                         (this_00,*(int *)(*(long *)(this_00 + 0x30) + 0x10 + lVar5));
      if (local_38 == pEVar3) {
        iVar2._M_current =
             (this->base_values_).
             super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (this->base_values_).
            super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<google::protobuf::EnumValueDescriptor_const*,std::allocator<google::protobuf::EnumValueDescriptor_const*>>
          ::_M_realloc_insert<google::protobuf::EnumValueDescriptor_const*const&>
                    ((vector<google::protobuf::EnumValueDescriptor_const*,std::allocator<google::protobuf::EnumValueDescriptor_const*>>
                      *)&this->base_values_,iVar2,&local_38);
        }
        else {
          *iVar2._M_current = local_38;
          pppEVar1 = &(this->base_values_).
                      super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppEVar1 = *pppEVar1 + 1;
        }
      }
      iVar2._M_current =
           (this->all_values_).
           super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->all_values_).
          super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<google::protobuf::EnumValueDescriptor_const*,std::allocator<google::protobuf::EnumValueDescriptor_const*>>
        ::_M_realloc_insert<google::protobuf::EnumValueDescriptor_const*const&>
                  ((vector<google::protobuf::EnumValueDescriptor_const*,std::allocator<google::protobuf::EnumValueDescriptor_const*>>
                    *)&this->all_values_,iVar2,&local_38);
      }
      else {
        *iVar2._M_current = local_38;
        pppEVar1 = &(this->all_values_).
                    super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppEVar1 = *pppEVar1 + 1;
      }
      lVar4 = lVar4 + 1;
      this_00 = this->descriptor_;
      lVar5 = lVar5 + 0x28;
    } while (lVar4 < *(int *)(this_00 + 0x2c));
  }
  return;
}

Assistant:

EnumGenerator::EnumGenerator(const EnumDescriptor* descriptor)
    : descriptor_(descriptor),
      name_(EnumName(descriptor_)) {
  for (int i = 0; i < descriptor_->value_count(); i++) {
    const EnumValueDescriptor* value = descriptor_->value(i);
    const EnumValueDescriptor* canonical_value =
        descriptor_->FindValueByNumber(value->number());

    if (value == canonical_value) {
      base_values_.push_back(value);
    }
    all_values_.push_back(value);
  }
}